

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCapsuleShape.cpp
# Opt level: O0

btVector3 __thiscall
btCapsuleShape::localGetSupportingVertexWithoutMargin(btCapsuleShape *this,btVector3 *vec0)

{
  int iVar1;
  btScalar *pbVar2;
  btScalar *in_RSI;
  btCapsuleShape *in_RDI;
  btScalar bVar3;
  undefined1 auVar5 [12];
  undefined8 uVar6;
  btVector3 bVar4;
  btVector3 pos_1;
  btVector3 pos;
  btScalar radius;
  btScalar newDot;
  btVector3 vtx;
  btScalar rlen;
  btScalar lenSqr;
  btVector3 vec;
  btScalar maxDot;
  btVector3 supVec;
  btCapsuleShape *in_stack_fffffffffffffe90;
  btVector3 *in_stack_fffffffffffffe98;
  btVector3 *this_00;
  btVector3 *in_stack_fffffffffffffea0;
  btVector3 *v;
  btScalar local_e8;
  btScalar local_e4;
  btScalar local_e0;
  btVector3 local_dc;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  btScalar local_98 [2];
  btScalar local_90 [2];
  btScalar local_88;
  btScalar local_84;
  btScalar local_80;
  btVector3 local_7c;
  btScalar local_6c;
  btScalar local_68;
  btVector3 local_64;
  float local_54;
  btScalar local_50;
  btScalar local_4c;
  btScalar local_48;
  btScalar local_44;
  btVector3 local_40;
  float local_30;
  btScalar local_2c;
  btScalar local_28;
  btScalar local_24;
  btScalar *local_20;
  btVector3 local_10;
  
  local_24 = 0.0;
  local_28 = 0.0;
  local_2c = 0.0;
  local_20 = in_RSI;
  btVector3::btVector3(&local_10,&local_24,&local_28,&local_2c);
  local_30 = -1e+18;
  local_40.m_floats._0_8_ = *(undefined8 *)local_20;
  local_40.m_floats._8_8_ = *(undefined8 *)(local_20 + 2);
  local_44 = btVector3::length2((btVector3 *)0x1aa62a);
  if (0.0001 <= local_44) {
    bVar3 = btSqrt(0.0);
    local_54 = 1.0 / bVar3;
    btVector3::operator*=(&local_40,&local_54);
  }
  else {
    local_48 = 1.0;
    local_4c = 0.0;
    local_50 = 0.0;
    btVector3::setValue(&local_40,&local_48,&local_4c,&local_50);
  }
  btVector3::btVector3(&local_64);
  local_6c = getRadius(in_stack_fffffffffffffe90);
  local_80 = 0.0;
  local_84 = 0.0;
  local_88 = 0.0;
  btVector3::btVector3(&local_7c,&local_80,&local_84,&local_88);
  bVar3 = getHalfHeight(in_stack_fffffffffffffe90);
  pbVar2 = btVector3::operator_cast_to_float_(&local_7c);
  iVar1 = getUpAxis(in_RDI);
  pbVar2[iVar1] = bVar3;
  bVar4 = ::operator*(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98->m_floats);
  local_b8 = bVar4.m_floats._0_8_;
  local_b0 = bVar4.m_floats._8_8_;
  bVar4 = operator+(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  local_a8 = bVar4.m_floats._0_8_;
  local_a0 = bVar4.m_floats._8_8_;
  (*(in_RDI->super_btConvexInternalShape).super_btConvexShape.super_btCollisionShape.
    _vptr_btCollisionShape[0xc])();
  bVar4 = ::operator*(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98->m_floats);
  local_c8 = bVar4.m_floats._0_8_;
  local_c0 = bVar4.m_floats._8_8_;
  bVar4 = operator-(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  local_98 = bVar4.m_floats._0_8_;
  local_90 = bVar4.m_floats._8_8_;
  local_64.m_floats._0_8_ = local_98;
  local_64.m_floats._8_8_ = local_90;
  local_68 = btVector3::dot(&local_40,&local_64);
  if (local_30 < local_68) {
    local_10.m_floats[0] = local_64.m_floats[0];
    local_10.m_floats[1] = local_64.m_floats[1];
    local_10.m_floats[2] = local_64.m_floats[2];
    local_10.m_floats[3] = local_64.m_floats[3];
    local_30 = local_68;
  }
  local_e0 = 0.0;
  local_e4 = 0.0;
  local_e8 = 0.0;
  this_00 = &local_dc;
  btVector3::btVector3(this_00,&local_e0,&local_e4,&local_e8);
  bVar3 = getHalfHeight(in_stack_fffffffffffffe90);
  pbVar2 = btVector3::operator_cast_to_float_(this_00);
  iVar1 = getUpAxis(in_RDI);
  pbVar2[iVar1] = -bVar3;
  v = &local_40;
  ::operator*(v,this_00->m_floats);
  operator+(v,this_00);
  (*(in_RDI->super_btConvexInternalShape).super_btConvexShape.super_btCollisionShape.
    _vptr_btCollisionShape[0xc])();
  ::operator*(v,this_00->m_floats);
  bVar4 = operator-(v,this_00);
  local_64.m_floats._0_8_ = bVar4.m_floats._0_8_;
  local_64.m_floats._8_8_ = bVar4.m_floats._8_8_;
  bVar3 = btVector3::dot(&local_40,&local_64);
  if (local_30 < bVar3) {
    local_10.m_floats[0] = local_64.m_floats[0];
    local_10.m_floats[1] = local_64.m_floats[1];
    local_10.m_floats[2] = local_64.m_floats[2];
    local_10.m_floats[3] = local_64.m_floats[3];
  }
  bVar4.m_floats[0] = local_10.m_floats[0];
  auVar5._4_4_ = local_10.m_floats[1];
  register0x00001240 = local_10.m_floats[2];
  register0x00001244 = local_10.m_floats[3];
  return (btVector3)bVar4.m_floats;
}

Assistant:

btVector3	btCapsuleShape::localGetSupportingVertexWithoutMargin(const btVector3& vec0)const
{

	btVector3 supVec(0,0,0);

	btScalar maxDot(btScalar(-BT_LARGE_FLOAT));

	btVector3 vec = vec0;
	btScalar lenSqr = vec.length2();
	if (lenSqr < btScalar(0.0001))
	{
		vec.setValue(1,0,0);
	} else
	{
		btScalar rlen = btScalar(1.) / btSqrt(lenSqr );
		vec *= rlen;
	}

	btVector3 vtx;
	btScalar newDot;
	
	btScalar radius = getRadius();


	{
		btVector3 pos(0,0,0);
		pos[getUpAxis()] = getHalfHeight();

		vtx = pos +vec*(radius) - vec * getMargin();
		newDot = vec.dot(vtx);
		if (newDot > maxDot)
		{
			maxDot = newDot;
			supVec = vtx;
		}
	}
	{
		btVector3 pos(0,0,0);
		pos[getUpAxis()] = -getHalfHeight();

		vtx = pos +vec*(radius) - vec * getMargin();
		newDot = vec.dot(vtx);
		if (newDot > maxDot)
		{
			maxDot = newDot;
			supVec = vtx;
		}
	}

	return supVec;

}